

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O0

void BinarySink_put_hex_data(BinarySink *bs,void *vptr,size_t len)

{
  byte bVar1;
  uint c;
  char *hexdigits;
  uchar *p;
  size_t len_local;
  void *vptr_local;
  BinarySink *bs_local;
  
  hexdigits = (char *)vptr;
  p = (uchar *)len;
  while (p != (uchar *)0x0) {
    bVar1 = *hexdigits;
    BinarySink_put_byte(bs->binarysink_,"0123456789abcdef"[bVar1 >> 4]);
    BinarySink_put_byte(bs->binarysink_,"0123456789abcdef"[bVar1 & 0xf]);
    hexdigits = hexdigits + 1;
    p = p + -1;
  }
  return;
}

Assistant:

void BinarySink_put_hex_data(BinarySink *bs, const void *vptr, size_t len)
{
    const unsigned char *p = (const unsigned char *)vptr;
    const char *hexdigits = "0123456789abcdef";
    while (len-- > 0) {
        unsigned c = *p++;
        put_byte(bs, hexdigits[0xF & (c >> 4)]);
        put_byte(bs, hexdigits[0xF & (c     )]);
    }
}